

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Resub(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  uint local_48;
  uint local_44;
  int fVeryVerbose;
  int fVerbose;
  int c;
  int nDivs;
  int nSupp;
  int nNodes;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nDivs = 0;
  c = 0;
  fVerbose = 0;
  local_44 = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_002a86cd:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"NSDvwh");
    if (iVar1 == -1) {
      if (argc == globalUtilOptind + 1) {
        pGVar2 = Gia_ManResub1(argv[globalUtilOptind],nDivs,c,fVerbose,0,0,local_44,local_48);
        Abc_FrameUpdateGia(pAbc,pGVar2);
        return 0;
      }
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Resub(): There is no AIG.\n");
        return 1;
      }
      pGVar2 = Gia_ManResub2(pAbc->pGia,nDivs,c,fVerbose,0,0,local_44,local_48);
      Abc_FrameUpdateGia(pAbc,pGVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(1,"Command line switch \"-D\" should be followed by a floating point number.\n");
        return 0;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    default:
      goto LAB_002a8958;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(1,"Command line switch \"-N\" should be followed by a floating point number.\n");
        return 0;
      }
      nDivs = atoi(argv[globalUtilOptind]);
      iVar1 = nDivs;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(1,"Command line switch \"-S\" should be followed by a floating point number.\n");
        return 0;
      }
      c = atoi(argv[globalUtilOptind]);
      iVar1 = c;
      break;
    case 0x68:
      goto LAB_002a8958;
    case 0x76:
      local_44 = local_44 ^ 1;
      goto LAB_002a86cd;
    case 0x77:
      local_48 = local_48 ^ 1;
      goto LAB_002a86cd;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002a8958:
      Abc_Print(-2,"usage: &resub [-NSD num] [-vwh]\n");
      Abc_Print(-2,"\t           performs AIG resubstitution\n");
      Abc_Print(-2,"\t-N num   : the limit on added nodes (num >= 0) [default = %d]\n",
                (ulong)(uint)nDivs);
      Abc_Print(-2,"\t-S num   : the limit on support size (num > 0) [default = %d]\n",
                (ulong)(uint)c);
      Abc_Print(-2,"\t-D num   : the limit on divisor count (num > 0) [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar3 = "no";
      if (local_44 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggles printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_48 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w       : toggles printing additional information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Resub( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManResub1( char * pFileName, int nNodes, int nSupp, int nDivs, int iChoice, int fUseXor, int fVerbose, int fVeryVerbose );
    extern Gia_Man_t * Gia_ManResub2( Gia_Man_t * pGia, int nNodes, int nSupp, int nDivs, int iChoice, int fUseXor, int fVerbose, int fVeryVerbose );
    Gia_Man_t * pTemp;
    int nNodes       =  0;
    int nSupp        =  0;
    int nDivs        =  0;
    int c, fVerbose  =  0;
    int fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NSDvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-N\" should be followed by a floating point number.\n" );
                return 0;
            }
            nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodes < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                return 0;
            }
            nSupp = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSupp < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                return 0;
            }
            nDivs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDivs < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
    {
        pTemp = Gia_ManResub1( argv[globalUtilOptind], nNodes, nSupp, nDivs, 0, 0, fVerbose, fVeryVerbose );
        Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Resub(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManResub2( pAbc->pGia, nNodes, nSupp, nDivs, 0, 0, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &resub [-NSD num] [-vwh]\n" );
    Abc_Print( -2, "\t           performs AIG resubstitution\n" );
    Abc_Print( -2, "\t-N num   : the limit on added nodes (num >= 0) [default = %d]\n",     nNodes );
    Abc_Print( -2, "\t-S num   : the limit on support size (num > 0) [default = %d]\n",     nSupp );
    Abc_Print( -2, "\t-D num   : the limit on divisor count (num > 0) [default = %d]\n",    nDivs );
    Abc_Print( -2, "\t-v       : toggles printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}